

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

int __thiscall OpenMD::OpenMDBitSet::nextOffBit(OpenMDBitSet *this,int fromIndex)

{
  const_reference cVar1;
  ulong __n;
  
  if (fromIndex < 0) {
LAB_00205001:
    fromIndex = -1;
  }
  else {
    __n = (ulong)(uint)fromIndex;
    do {
      __n = __n + 1;
      fromIndex = fromIndex + 1;
      if ((int)((*(int *)&(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                *(int *)&(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
               (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) <= fromIndex)
      goto LAB_00205001;
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->bitset_,__n);
    } while (cVar1);
  }
  return fromIndex;
}

Assistant:

int OpenMDBitSet::nextOffBit(int fromIndex) const {
    if (fromIndex <= -1) {
      // in case -1 or other negative number is passed to this function
      return -1;
    }

    ++fromIndex;
    while (fromIndex < static_cast<int>(size())) {
      if (!bitset_[fromIndex]) { return fromIndex; }
      ++fromIndex;
    }

    return -1;
  }